

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int mbedtls_ecp_copy(mbedtls_ecp_point *P,mbedtls_ecp_point *Q)

{
  int iVar1;
  
  iVar1 = mbedtls_mpi_copy(&P->X,&Q->X);
  if (iVar1 == 0) {
    iVar1 = mbedtls_mpi_copy(&P->Y,&Q->Y);
    if (iVar1 == 0) {
      iVar1 = mbedtls_mpi_copy(&P->Z,&Q->Z);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ecp_copy(mbedtls_ecp_point *P, const mbedtls_ecp_point *Q)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&P->X, &Q->X));
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&P->Y, &Q->Y));
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&P->Z, &Q->Z));

cleanup:
    return ret;
}